

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionInfo.cpp
# Opt level: O2

void __thiscall chrono::collision::ChCollisionInfo::SwapModels(ChCollisionInfo *this)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  
  auVar3._0_8_ = this->modelA;
  auVar3._8_8_ = this->modelB;
  auVar3 = vpermilps_avx(auVar3,0x4e);
  this->modelA = (ChCollisionModel *)auVar3._0_8_;
  this->modelB = (ChCollisionModel *)auVar3._8_8_;
  dVar1 = (this->vpA).m_data[2];
  auVar2._0_24_ = *(undefined1 (*) [24])&this->vpA;
  auVar2._24_8_ = (this->vpB).m_data[0];
  auVar2 = vperm2f128_avx(*(undefined1 (*) [32])((this->vpB).m_data + 1),auVar2,0x20);
  (this->vpA).m_data[0] = (this->vpB).m_data[0];
  *(undefined1 (*) [32])((this->vpA).m_data + 1) = auVar2;
  (this->vpB).m_data[2] = dVar1;
  auVar7._0_8_ = -(this->vN).m_data[2];
  auVar7._8_4_ = 0;
  auVar7._12_4_ = 0x80000000;
  uVar4 = *(uint *)((long)(this->vN).m_data + 4);
  uVar5 = *(undefined4 *)((this->vN).m_data + 1);
  uVar6 = *(uint *)((long)(this->vN).m_data + 0xc);
  *(undefined4 *)(this->vN).m_data = *(undefined4 *)(this->vN).m_data;
  *(uint *)((long)(this->vN).m_data + 4) = uVar4 ^ 0x80000000;
  *(undefined4 *)((this->vN).m_data + 1) = uVar5;
  *(uint *)((long)(this->vN).m_data + 0xc) = uVar6 ^ 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar7);
  (this->vN).m_data[2] = dVar1;
  return;
}

Assistant:

void ChCollisionInfo::SwapModels() {
    ChCollisionModel* modeltemp;
    modeltemp = modelA;
    modelA = modelB;
    modelB = modeltemp;
    ChVector<> vtemp;
    vtemp = vpA;
    vpA = vpB;
    vpB = vtemp;
    vN = Vmul(vN, -1.0);
}